

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_debug_assert_not_added_(event *ev)

{
  undefined1 local_30 [8];
  event_debug_entry find;
  event_debug_entry *dent;
  event *ev_local;
  
  if (event_debug_mode_on_ != 0) {
    find.node.hte_next = (event_debug_entry *)ev;
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    find._16_8_ = event_debug_map_HT_FIND(&global_debug_map,(event_debug_entry *)local_30);
    if (((event_debug_entry *)find._16_8_ != (event_debug_entry *)0x0) &&
       ((((event_debug_entry *)find._16_8_)->field_0x10 & 1) != 0)) {
      event_errx(-0x21522153,
                 "%s called on an already added event %p (events: 0x%x, fd: %d, flags: 0x%x)",
                 "event_debug_assert_not_added_",ev,(ulong)(uint)(int)ev->ev_events,
                 (ulong)(uint)ev->ev_fd,(int)(ev->ev_evcallback).evcb_flags);
    }
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  return;
}

Assistant:

static void event_debug_assert_not_added_(const struct event *ev)
{
	struct event_debug_entry *dent, find;

	if (!event_debug_mode_on_)
		return;

	find.ptr = ev;
	EVLOCK_LOCK(event_debug_map_lock_, 0);
	dent = HT_FIND(event_debug_map, &global_debug_map, &find);
	if (dent && dent->added) {
		event_errx(EVENT_ERR_ABORT_,
		    "%s called on an already added event %p"
		    " (events: 0x%x, fd: "EV_SOCK_FMT", "
		    "flags: 0x%x)",
		    __func__, ev, ev->ev_events,
		    EV_SOCK_ARG(ev->ev_fd), ev->ev_flags);
	}
	EVLOCK_UNLOCK(event_debug_map_lock_, 0);
}